

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O0

bool ON_IsPointGridClosed
               (int dim,bool is_rat,int point_count0,int point_count1,int point_stride0,
               int point_stride1,double *p,int dir)

{
  int iVar1;
  double *local_40;
  double *p1;
  double *p0;
  int local_28;
  int stride;
  int count;
  bool rc;
  int point_stride1_local;
  int point_stride0_local;
  int point_count1_local;
  int point_count0_local;
  bool is_rat_local;
  int dim_local;
  
  stride._3_1_ = false;
  if (((0 < point_count0) && (0 < point_count1)) && (p != (double *)0x0)) {
    if (dir == 0) {
      iVar1 = (point_count0 + -1) * point_stride0;
      p0._4_4_ = point_stride1;
      local_28 = point_count1;
    }
    else {
      iVar1 = (point_count1 + -1) * point_stride1;
      p0._4_4_ = point_stride0;
      local_28 = point_count0;
    }
    local_40 = p + iVar1;
    iVar1 = ON_ComparePointList(dim,is_rat,local_28,p0._4_4_,p,p0._4_4_,local_40);
    stride._3_1_ = iVar1 == 0;
  }
  return stride._3_1_;
}

Assistant:

bool 
ON_IsPointGridClosed(
        int dim,
        bool is_rat,
        int point_count0, int point_count1,
        int point_stride0, int point_stride1,
        const double* p,
        int dir
       )
{
  bool rc = false;
  if ( point_count0>0 && point_count1>0 && p != nullptr ) {
    int count, stride;
    const double* p0;
    const double* p1;
    if ( dir ) {
      p0 = p;
      p1 = p + (point_count1-1)*point_stride1;
      count = point_count0;
      stride = point_stride0;
    }
    else {
      p0 = p;
      p1 = p + (point_count0-1)*point_stride0;
      count = point_count1;
      stride = point_stride1;
    }
    rc = (0==ON_ComparePointList( dim, is_rat, count, stride, p0, stride, p1 ))?true:false;
  }
  return rc;
}